

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pragma.cpp
# Opt level: O3

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::TransformPragma(Transformer *this,PGPragmaStmt *stmt)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  pointer pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  size_type sVar5;
  __node_base args;
  __uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_> _Var6;
  bool bVar7;
  PragmaStatement *this_00;
  pointer pPVar8;
  type pPVar9;
  pointer pPVar10;
  BaseExpression *pBVar11;
  ComparisonExpression *pCVar12;
  ColumnRefExpression *pCVar13;
  ConstantExpression *pCVar14;
  string *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  InternalException *pIVar17;
  iterator iVar18;
  reference args_1;
  ParserException *pPVar19;
  size_type in_RDX;
  _Alloc_hider _Var20;
  long lVar21;
  case_insensitive_set_t sqlite_compat_pragmas;
  _Head_base<0UL,_duckdb::ConstantExpression_*,_false> local_140;
  undefined1 local_131;
  Value local_130;
  SetScope local_f0;
  undefined7 uStack_ef;
  ParserOptions *local_e8;
  _Head_base<0UL,_duckdb::PragmaStatement_*,_false> local_e0;
  Value local_d8;
  type local_98;
  size_type local_90;
  __node_base local_88;
  __uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_> local_80;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_78;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  this_00 = (PragmaStatement *)operator_new(0x80);
  PragmaStatement::PragmaStatement(this_00);
  local_e0._M_head_impl = this_00;
  local_80._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       (tuple<duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)
       (tuple<duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)this;
  pPVar8 = unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>::
           operator->((unique_ptr<duckdb::PragmaStatement,_std::default_delete<duckdb::PragmaStatement>,_true>
                       *)&local_e0);
  pPVar9 = unique_ptr<duckdb::PragmaInfo,_std::default_delete<duckdb::PragmaInfo>,_true>::operator*
                     (&pPVar8->info);
  __s = *(char **)(in_RDX + 8);
  pcVar2 = (char *)(pPVar9->name)._M_string_length;
  local_90 = in_RDX;
  strlen(__s);
  sVar5 = local_90;
  local_88._M_nxt = (_Hash_node_base *)&pPVar9->name;
  ::std::__cxx11::string::_M_replace((ulong)&pPVar9->name,0,pcVar2,(ulong)__s);
  local_98 = pPVar9;
  if ((*(long *)(sVar5 + 0x10) != 0) &&
     (lVar21 = *(long *)(*(long *)(sVar5 + 0x10) + 8), lVar21 != 0)) {
    local_e8 = (ParserOptions *)&pPVar9->parameters;
    local_78 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&pPVar9->named_parameters;
    p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_d8 + 0x10);
    do {
      TransformExpression((Transformer *)&local_f0,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)&local_f0);
      if ((pPVar10->super_BaseExpression).type == COMPARE_BOUNDARY_START) {
        pBVar11 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&local_f0)->super_BaseExpression;
        pCVar12 = BaseExpression::Cast<duckdb::ComparisonExpression>(pBVar11);
        pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(&pCVar12->left);
        if ((pPVar10->super_BaseExpression).type != COLUMN_REF) {
          pPVar19 = (ParserException *)__cxa_allocate_exception(0x10);
          local_130.type_._0_8_ =
               &local_130.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"Named parameter requires a column reference on the LHS",
                     "");
          ParserException::ParserException(pPVar19,(string *)&local_130);
          __cxa_throw(pPVar19,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pBVar11 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(&pCVar12->left)->super_BaseExpression;
        pCVar13 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar11);
        (*(pCVar13->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
                  (&local_d8,pCVar13);
        local_130.type_._0_8_ =
             &local_130.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_d8.type_._0_8_ == p_Var4) {
          local_130.is_null = local_d8.is_null;
          local_130._25_3_ = local_d8._25_3_;
          local_130._28_4_ = local_d8._28_4_;
        }
        else {
          local_130.type_.id_ = local_d8.type_.id_;
          local_130.type_.physical_type_ = local_d8.type_.physical_type_;
          local_130.type_._2_6_ = local_d8.type_._2_6_;
        }
        local_130.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = local_d8.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_;
        local_130.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = (uint)local_d8.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_130.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_d8.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_d8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = (uint)local_d8.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi & 0xffffff00;
        local_130.value_.bigint =
             (int64_t)(pCVar12->right).
                      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pCVar12->right).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)0x0;
        local_d8.type_._0_8_ = p_Var4;
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  (local_78,&local_130);
        if (local_130.value_._0_8_ != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)local_130.value_.bigint + 8))();
        }
        local_130.value_.bigint = 0;
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_130.type_._0_8_ !=
            &local_130.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_130.type_._0_8_);
        }
        _Var20._M_p = (pointer)local_d8.type_._0_8_;
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_d8.type_._0_8_ != p_Var4) {
LAB_012703ac:
          operator_delete(_Var20._M_p);
        }
      }
      else {
        pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)&local_f0);
        if ((pPVar10->super_BaseExpression).type == COLUMN_REF) {
          pBVar11 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&local_f0)->super_BaseExpression;
          pCVar13 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar11);
          bVar7 = ColumnRefExpression::IsQualified(pCVar13);
          if (bVar7) {
            pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                    *)&local_f0);
            (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar10);
            Value::Value(&local_d8,&local_50);
            pCVar14 = (ConstantExpression *)operator_new(0x78);
            Value::Value(&local_130,&local_d8);
            ConstantExpression::ConstantExpression(pCVar14,&local_130);
            local_140._M_head_impl = pCVar14;
            Value::~Value(&local_130);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)local_e8,
                       (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                        *)&local_140);
            if (local_140._M_head_impl != (ConstantExpression *)0x0) {
              (*((local_140._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                _vptr_BaseExpression[1])();
            }
            local_140._M_head_impl = (ConstantExpression *)0x0;
            Value::~Value(&local_d8);
            paVar16 = &local_50.field_2;
            _Var20._M_p = local_50._M_dataplus._M_p;
          }
          else {
            psVar15 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar13);
            local_70._0_8_ = local_70 + 0x10;
            pcVar3 = (psVar15->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,pcVar3,pcVar3 + psVar15->_M_string_length);
            Value::Value(&local_d8,(string *)local_70);
            pCVar14 = (ConstantExpression *)operator_new(0x78);
            Value::Value(&local_130,&local_d8);
            ConstantExpression::ConstantExpression(pCVar14,&local_130);
            local_140._M_head_impl = pCVar14;
            Value::~Value(&local_130);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)local_e8,
                       (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                        *)&local_140);
            if (local_140._M_head_impl != (ConstantExpression *)0x0) {
              (*((local_140._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                _vptr_BaseExpression[1])();
            }
            local_140._M_head_impl = (ConstantExpression *)0x0;
            Value::~Value(&local_d8);
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_70 + 0x10);
            _Var20._M_p = (pointer)local_70._0_8_;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var20._M_p != paVar16) goto LAB_012703ac;
        }
        else {
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)local_e8,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_f0);
        }
      }
      if ((long *)CONCAT71(uStack_ef,local_f0) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(uStack_ef,local_f0) + 8))();
      }
      lVar21 = *(long *)(lVar21 + 8);
    } while (lVar21 != 0);
  }
  _Var6._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       local_80._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  pPVar9 = local_98;
  iVar1 = *(int *)(local_90 + 4);
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      if ((long)(local_98->parameters).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_98->parameters).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        pPVar19 = (ParserException *)__cxa_allocate_exception(0x10);
        local_130.type_._0_8_ =
             &local_130.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,
                   "PRAGMA statement with assignment should contain exactly one parameter","");
        ParserException::ParserException(pPVar19,(string *)&local_130);
        __cxa_throw(pPVar19,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((local_98->named_parameters)._M_h._M_element_count != 0) {
        pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
        local_130.type_._0_8_ =
             &local_130.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,
                   "PRAGMA statement with assignment cannot have named parameters","");
        InternalException::InternalException(pIVar17,(string *)&local_130);
        __cxa_throw(pIVar17,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_d8.type_._0_8_ = (__buckets_ptr)((long)&local_d8 + 0x10U);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"table_info","");
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_130,&local_d8,(long)&local_d8 + 0x20,0,&local_f0,&local_140,&local_131);
      if ((__buckets_ptr)local_d8.type_._0_8_ != (__buckets_ptr)((long)&local_d8 + 0x10U)) {
        operator_delete((void *)local_d8.type_._0_8_);
      }
      args._M_nxt = local_88._M_nxt;
      iVar18 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&local_130,(key_type *)local_88._M_nxt);
      if (iVar18.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        args_1 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::operator[](&pPVar9->parameters,0);
        local_f0 = AUTOMATIC;
        make_uniq<duckdb::SetVariableStatement,std::__cxx11::string&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::SetScope>
                  ((duckdb *)&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args._M_nxt,
                   args_1,&local_f0);
        *(undefined8 *)
         _Var6._M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = local_d8.type_._0_8_;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&local_130);
        if (local_e0._M_head_impl == (PragmaStatement *)0x0) {
          return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
                 _Var6._M_t.
                 super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                 .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
        }
        (*((local_e0._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
        return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
               _Var6._M_t.
               super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
               .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_130);
    }
    else {
      if (iVar1 != 0) {
        pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
        local_130.type_._0_8_ =
             &local_130.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"Unknown pragma type","");
        InternalException::InternalException(pIVar17,(string *)&local_130);
        __cxa_throw(pIVar17,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (((local_98->parameters).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (local_98->parameters).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         ((local_98->named_parameters)._M_h._M_element_count != 0)) {
        pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
        local_130.type_._0_8_ =
             &local_130.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,
                   "PRAGMA statement that is not a call or assignment cannot contain parameters","")
        ;
        InternalException::InternalException(pIVar17,(string *)&local_130);
        __cxa_throw(pIVar17,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  *(PragmaStatement **)
   _Var6._M_t.
   super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
   super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = local_e0._M_head_impl;
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (_Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>)
         _Var6._M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<SQLStatement> Transformer::TransformPragma(duckdb_libpgquery::PGPragmaStmt &stmt) {
	auto result = make_uniq<PragmaStatement>();
	auto &info = *result->info;

	info.name = stmt.name;
	// parse the arguments, if any
	if (stmt.args) {
		for (auto cell = stmt.args->head; cell != nullptr; cell = cell->next) {
			auto node = PGPointerCast<duckdb_libpgquery::PGNode>(cell->data.ptr_value);
			auto expr = TransformExpression(node);

			if (expr->GetExpressionType() == ExpressionType::COMPARE_EQUAL) {
				auto &comp = expr->Cast<ComparisonExpression>();
				if (comp.left->GetExpressionType() != ExpressionType::COLUMN_REF) {
					throw ParserException("Named parameter requires a column reference on the LHS");
				}
				auto &columnref = comp.left->Cast<ColumnRefExpression>();
				info.named_parameters.insert(make_pair(columnref.GetName(), std::move(comp.right)));
			} else if (expr->GetExpressionType() == ExpressionType::COLUMN_REF) {
				auto &colref = expr->Cast<ColumnRefExpression>();
				if (!colref.IsQualified()) {
					info.parameters.emplace_back(make_uniq<ConstantExpression>(Value(colref.GetColumnName())));
				} else {
					info.parameters.emplace_back(make_uniq<ConstantExpression>(Value(expr->ToString())));
				}
			} else {
				info.parameters.emplace_back(std::move(expr));
			}
		}
	}
	// now parse the pragma type
	switch (stmt.kind) {
	case duckdb_libpgquery::PG_PRAGMA_TYPE_NOTHING: {
		if (!info.parameters.empty() || !info.named_parameters.empty()) {
			throw InternalException("PRAGMA statement that is not a call or assignment cannot contain parameters");
		}
		break;
	case duckdb_libpgquery::PG_PRAGMA_TYPE_ASSIGNMENT:
		if (info.parameters.size() != 1) {
			throw ParserException("PRAGMA statement with assignment should contain exactly one parameter");
		}
		if (!info.named_parameters.empty()) {
			throw InternalException("PRAGMA statement with assignment cannot have named parameters");
		}
		// SQLite does not distinguish between:
		// "PRAGMA table_info='integers'"
		// "PRAGMA table_info('integers')"
		// for compatibility, any pragmas that match the SQLite ones are parsed as calls
		case_insensitive_set_t sqlite_compat_pragmas {"table_info"};
		if (sqlite_compat_pragmas.find(info.name) != sqlite_compat_pragmas.end()) {
			break;
		}
		auto set_statement =
		    make_uniq<SetVariableStatement>(info.name, std::move(info.parameters[0]), SetScope::AUTOMATIC);
		return std::move(set_statement);
	}
	case duckdb_libpgquery::PG_PRAGMA_TYPE_CALL:
		break;
	default:
		throw InternalException("Unknown pragma type");
	}

	return std::move(result);
}